

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall
glslang::TDefaultGlslIoResolver::reserverResourceSlot
          (TDefaultGlslIoResolver *this,TVarEntryInfo *ent,TInfoSink *infoSink)

{
  char cVar1;
  int iVar2;
  TResourceType TVar3;
  TResourceType set;
  int size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  *this_00;
  iterator iVar6;
  mapped_type *pmVar7;
  key_type *__k;
  int resourceKey;
  key_type *local_70;
  uint local_68;
  TResourceType local_64;
  TInfoSink *local_60;
  TString errorMsg;
  long *plVar4;
  
  local_60 = infoSink;
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  TVar3 = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                    (this,plVar4);
  set = TVar3;
  if ((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl == 0) {
    set = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[4])
                    (this,(ulong)ent->stage,ent);
  }
  resourceKey = set;
  lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
  if ((short)((ulong)*(undefined8 *)(lVar5 + 0x1c) >> 0x20) != -1) {
    this_00 = &std::
               map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
               ::operator[](&this->resourceSlotMap,&resourceKey)->_M_t;
    local_70 = (key_type *)CONCAT44(extraout_var_00,iVar2);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
            ::find(this_00,(key_type *)CONCAT44(extraout_var_00,iVar2));
    local_64 = TVar3;
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    local_68 = (uint)*(ushort *)(lVar5 + 0x20);
    iVar2 = TDefaultIoResolverBase::getBaseBinding
                      (&this->super_TDefaultIoResolverBase,ent->stage,local_64,set);
    iVar2 = iVar2 + local_68;
    if ((_Rb_tree_header *)iVar6._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      size = 1;
      __k = local_70;
      if (((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl != 0)
         && (cVar1 = (**(code **)(*plVar4 + 0xf0))(plVar4), __k = local_70, cVar1 != '\0')) {
        size = (**(code **)(*plVar4 + 0x88))(plVar4);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                             *)this_00,__k);
      *pmVar7 = iVar2;
      TDefaultIoResolverBase::reserveSlot
                (&this->super_TDefaultIoResolverBase,resourceKey,iVar2,size);
    }
    else if (*(int *)&iVar6._M_node[2]._M_parent != iVar2) {
      std::operator+(&errorMsg,"Invalid binding: ",local_70);
      TInfoSinkBase::message(&local_60->info,EPrefixInternalError,errorMsg._M_dataplus._M_p);
      (this->super_TDefaultIoResolverBase).hasError = true;
    }
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::reserverResourceSlot(TVarEntryInfo& ent, TInfoSink& infoSink) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    TResourceType resource = getResourceType(type);
    int set = referenceIntermediate.getSpv().openGl != 0 ? resource : resolveSet(ent.stage, ent);
    int resourceKey = set;

    if (type.getQualifier().hasBinding()) {
        TVarSlotMap& varSlotMap = resourceSlotMap[resourceKey];
        TVarSlotMap::iterator iter = varSlotMap.find(name);
        int binding = type.getQualifier().layoutBinding + getBaseBinding(ent.stage, resource, set);

        if (iter == varSlotMap.end()) {
            // Reserve the slots for the ubo, ssbo and opaques who has explicit binding
            int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
            varSlotMap[name] = binding;
            reserveSlot(resourceKey, binding, numBindings);
        } else {
            // Allocate binding by name for OpenGL driver, so the resource in different
            // stages should be declared with the same binding
            if (iter->second != binding) {
                TString errorMsg = "Invalid binding: " + name;
                infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                hasError = true;
            }
        }
    }
}